

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsortfilterproxymodel.cpp
# Opt level: O3

void QSortFilterProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> *pQVar1;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> QVar2;
  code *pcVar3;
  long lVar4;
  parameter_type pVar5;
  parameter_type pVar6;
  parameter_type re;
  QBindableInterface *pQVar7;
  long *plVar8;
  int iVar9;
  QRegularExpression *regularExpression;
  long in_FS_OFFSET;
  undefined4 local_2c;
  QRegularExpression local_28;
  undefined4 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_2c = CONCAT31(local_2c._1_3_,*_a[1]);
      iVar9 = 0;
      break;
    case 1:
      local_2c = *_a[1];
      iVar9 = 1;
      break;
    case 2:
      local_2c = *_a[1];
      iVar9 = 2;
      break;
    case 3:
      local_2c = CONCAT31(local_2c._1_3_,*_a[1]);
      iVar9 = 3;
      break;
    case 4:
      local_2c = *_a[1];
      iVar9 = 4;
      break;
    case 5:
      local_2c = *_a[1];
      iVar9 = 5;
      break;
    case 6:
      local_2c = CONCAT31(local_2c._1_3_,*_a[1]);
      iVar9 = 6;
      break;
    case 7:
      local_2c = CONCAT31(local_2c._1_3_,*_a[1]);
      iVar9 = 7;
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFilterRegularExpression((QSortFilterProxyModel *)_o,(QString *)_a[1]);
        return;
      }
      goto LAB_0047ca3f;
    case 9:
      regularExpression = (QRegularExpression *)_a[1];
switchD_0047c3c4_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFilterRegularExpression((QSortFilterProxyModel *)_o,regularExpression);
        return;
      }
      goto LAB_0047ca3f;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFilterWildcard((QSortFilterProxyModel *)_o,(QString *)_a[1]);
        return;
      }
      goto LAB_0047ca3f;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFilterFixedString((QSortFilterProxyModel *)_o,(QString *)_a[1]);
        return;
      }
      goto LAB_0047ca3f;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        invalidate((QSortFilterProxyModel *)_o);
        return;
      }
      goto LAB_0047ca3f;
    default:
      goto switchD_0047c35e_caseD_3;
    }
    local_20 = &local_2c;
    local_28.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
         (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar9,(void **)&local_28);
    break;
  case ReadProperty:
    if (9 < (uint)_id) break;
    pQVar1 = (QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)*_a;
    switch(_id) {
    case 0:
      re = QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
           ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                    *)&(_o->d_ptr).d[3].children.d.size);
      QRegularExpression::QRegularExpression(&local_28,re);
      QVar2.d.ptr = pQVar1->d;
      pQVar1->d = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)local_28.d.d.ptr;
      local_28.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)QVar2.d.ptr;
      QRegularExpression::~QRegularExpression(&local_28);
      goto switchD_0047c35e_caseD_3;
    case 1:
      pVar6 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>
                       *)&(_o->d_ptr).d[3].children);
      break;
    case 2:
      pVar5 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
                       *)((long)&(_o->d_ptr).d[3].children.d.ptr + 3));
      goto LAB_0047c775;
    case 3:
      pVar6 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
                       *)((long)&(_o->d_ptr).d[3].children.d.ptr + 4));
      break;
    case 4:
      pVar6 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_sort_casesensitivity_offset,_&QSortFilterProxyModelPrivate::setSortCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::sortCaseSensitivityChangedForwarder,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_sort_casesensitivity_offset,_&QSortFilterProxyModelPrivate::setSortCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::sortCaseSensitivityChangedForwarder,_nullptr>
                       *)&(_o->d_ptr).d[3].parent);
      break;
    case 5:
      pVar5 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_sort_localeaware_offset,_&QSortFilterProxyModelPrivate::setSortLocaleAwareForwarder,_&QSortFilterProxyModelPrivate::sortLocaleAwareChangedForwarder,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_sort_localeaware_offset,_&QSortFilterProxyModelPrivate::setSortLocaleAwareForwarder,_&QSortFilterProxyModelPrivate::sortLocaleAwareChangedForwarder,_nullptr>
                       *)&(_o->d_ptr).d[3].children.d.ptr);
      goto LAB_0047c775;
    case 6:
      pVar6 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
                       *)((long)&(_o->d_ptr).d[3].parent + 4));
      break;
    case 7:
      pVar6 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>
                       *)((long)&(_o->d_ptr).d[3].children.d.d + 4));
      break;
    case 8:
      pVar5 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
                       *)((long)&(_o->d_ptr).d[3].children.d.ptr + 1));
      goto LAB_0047c775;
    case 9:
      pVar5 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_accept_children_offset,_&QSortFilterProxyModelPrivate::setAutoAcceptChildRowsForwarder,_&QSortFilterProxyModelPrivate::autoAcceptChildRowsChangedForwarder,_nullptr>
              ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_accept_children_offset,_&QSortFilterProxyModelPrivate::setAutoAcceptChildRowsForwarder,_&QSortFilterProxyModelPrivate::autoAcceptChildRowsChangedForwarder,_nullptr>
                       *)((long)&(_o->d_ptr).d[3].children.d.ptr + 2));
LAB_0047c775:
      *(parameter_type *)&pQVar1->d = pVar5;
      goto switchD_0047c35e_caseD_3;
    }
    *(parameter_type *)&pQVar1->d = pVar6;
    break;
  case WriteProperty:
    if ((uint)_id < 10) {
      regularExpression = (QRegularExpression *)*_a;
      switch(_id) {
      case 0:
        goto switchD_0047c3c4_caseD_0;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFilterKeyColumn((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDynamicSortFilter((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFilterCaseSensitivity
                    ((QSortFilterProxyModel *)_o,*(CaseSensitivity *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSortCaseSensitivity
                    ((QSortFilterProxyModel *)_o,*(CaseSensitivity *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSortLocaleAware((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSortRole((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFilterRole((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setRecursiveFilteringEnabled
                    ((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setAutoAcceptChildRows((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr)
          ;
          return;
        }
      }
      goto LAB_0047ca3f;
    }
    break;
  case IndexOfMethod:
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == dynamicSortFilterChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar3 == filterCaseSensitivityChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar3 == sortCaseSensitivityChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar3 == sortLocaleAwareChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar3 == sortRoleChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar3 == filterRoleChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar3 == recursiveFilteringEnabledChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar3 == autoAcceptChildRowsChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 7;
    }
    break;
  case BindableProperty:
    switch(_id) {
    case 0:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[3].children.d.size;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 1:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[3].children;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 2:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 3);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 3:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 4);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 4:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[3].parent;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_sort_casesensitivity_offset,_&QSortFilterProxyModelPrivate::setSortCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::sortCaseSensitivityChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 5:
      plVar8 = (long *)*_a;
      *plVar8 = (long)&(_o->d_ptr).d[3].children.d.ptr;
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_sort_localeaware_offset,_&QSortFilterProxyModelPrivate::setSortLocaleAwareForwarder,_&QSortFilterProxyModelPrivate::sortLocaleAwareChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 6:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[3].parent + 4);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 7:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[3].children.d.d + 4);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 8:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 1);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 9:
      plVar8 = (long *)*_a;
      *plVar8 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 2);
      pQVar7 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_accept_children_offset,_&QSortFilterProxyModelPrivate::setAutoAcceptChildRowsForwarder,_&QSortFilterProxyModelPrivate::autoAcceptChildRowsChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    default:
      goto switchD_0047c35e_caseD_3;
    }
    plVar8[1] = (long)pQVar7;
  }
switchD_0047c35e_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0047ca3f:
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSortFilterProxyModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dynamicSortFilterChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->filterCaseSensitivityChanged((*reinterpret_cast< std::add_pointer_t<Qt::CaseSensitivity>>(_a[1]))); break;
        case 2: _t->sortCaseSensitivityChanged((*reinterpret_cast< std::add_pointer_t<Qt::CaseSensitivity>>(_a[1]))); break;
        case 3: _t->sortLocaleAwareChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->sortRoleChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->filterRoleChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->recursiveFilteringEnabledChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 7: _t->autoAcceptChildRowsChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setFilterRegularExpression((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFilterRegularExpression((*reinterpret_cast< std::add_pointer_t<QRegularExpression>>(_a[1]))); break;
        case 10: _t->setFilterWildcard((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 11: _t->setFilterFixedString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: _t->invalidate(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::dynamicSortFilterChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(Qt::CaseSensitivity )>(_a, &QSortFilterProxyModel::filterCaseSensitivityChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(Qt::CaseSensitivity )>(_a, &QSortFilterProxyModel::sortCaseSensitivityChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::sortLocaleAwareChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(int )>(_a, &QSortFilterProxyModel::sortRoleChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(int )>(_a, &QSortFilterProxyModel::filterRoleChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::recursiveFilteringEnabledChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::autoAcceptChildRowsChanged, 7))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QRegularExpression*>(_v) = _t->filterRegularExpression(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->filterKeyColumn(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->dynamicSortFilter(); break;
        case 3: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->filterCaseSensitivity(); break;
        case 4: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->sortCaseSensitivity(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isSortLocaleAware(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->sortRole(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->filterRole(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isRecursiveFilteringEnabled(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->autoAcceptChildRows(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilterRegularExpression(*reinterpret_cast<QRegularExpression*>(_v)); break;
        case 1: _t->setFilterKeyColumn(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setDynamicSortFilter(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setFilterCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 4: _t->setSortCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 5: _t->setSortLocaleAware(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setSortRole(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setFilterRole(*reinterpret_cast<int*>(_v)); break;
        case 8: _t->setRecursiveFilteringEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setAutoAcceptChildRows(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterRegularExpression(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterKeyColumn(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDynamicSortFilter(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterCaseSensitivity(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSortCaseSensitivity(); break;
        case 5: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableIsSortLocaleAware(); break;
        case 6: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSortRole(); break;
        case 7: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterRole(); break;
        case 8: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableRecursiveFilteringEnabled(); break;
        case 9: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableAutoAcceptChildRows(); break;
        default: break;
        }
    }
}